

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int ERKStepWriteButcher(void *arkode_mem,FILE *fp)

{
  FILE *in_RSI;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  FILE *in_stack_ffffffffffffffc8;
  ARKodeButcherTable in_stack_ffffffffffffffd0;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = erkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                       (ARKodeMem *)in_stack_ffffffffffffffc8,(ARKodeERKStepMem *)0x148679);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd0->b == (sunrealtype *)0x0) {
      arkProcessError(in_stack_ffffffffffffffd8,-0x15,0x2ff,"ERKStepWriteButcher",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep_io.c"
                      ,"Butcher table memory is NULL");
      local_4 = -0x15;
    }
    else {
      fprintf(in_RSI,"\nERKStep Butcher table (stages = %i):\n",
              (ulong)*(uint *)&in_stack_ffffffffffffffd0->c);
      ARKodeButcherTable_Write(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      fprintf(in_RSI,"\n");
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ERKStepWriteButcher(void* arkode_mem, FILE* fp)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;

  /* access ARKodeMem and ARKodeERKStepMem structures */
  retval = erkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check that Butcher table is non-NULL (otherwise report error) */
  if (step_mem->B == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    "Butcher table memory is NULL");
    return (ARK_MEM_NULL);
  }

  /* print Butcher table to file */
  fprintf(fp, "\nERKStep Butcher table (stages = %i):\n", step_mem->stages);
  ARKodeButcherTable_Write(step_mem->B, fp);
  fprintf(fp, "\n");

  return (ARK_SUCCESS);
}